

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O2

btMatrix3x3 * __thiscall btMatrix3x3::inverse(btMatrix3x3 *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  btMatrix3x3 *in_RDI;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  fVar1 = this->m_el[1].m_floats[1];
  fVar2 = this->m_el[1].m_floats[2];
  fVar3 = this->m_el[0].m_floats[0];
  fVar4 = this->m_el[0].m_floats[1];
  fVar5 = this->m_el[0].m_floats[2];
  uVar8 = *(undefined8 *)(this->m_el[2].m_floats + 1);
  fVar11 = (float)uVar8;
  fVar12 = (float)((ulong)uVar8 >> 0x20);
  fVar6 = this->m_el[2].m_floats[0];
  fVar7 = this->m_el[1].m_floats[0];
  fVar10 = fVar1 * fVar12 - fVar2 * fVar11;
  uVar8 = *(undefined8 *)this->m_el[2].m_floats;
  in_RDI->m_el[0].m_floats[3] = 0.0;
  fVar13 = fVar6 * fVar2 - fVar12 * fVar7;
  in_RDI->m_el[1].m_floats[3] = 0.0;
  fVar14 = fVar11 * fVar7 - fVar1 * (float)uVar8;
  fVar9 = 1.0 / (fVar5 * fVar14 + fVar3 * fVar10 + fVar4 * fVar13);
  *(ulong *)in_RDI->m_el[0].m_floats =
       CONCAT44((fVar5 * fVar11 - fVar4 * fVar12) * fVar9,fVar10 * fVar9);
  in_RDI->m_el[0].m_floats[2] = (fVar4 * fVar2 + -fVar5 * fVar1) * fVar9;
  *(ulong *)in_RDI->m_el[1].m_floats =
       CONCAT44((fVar12 * fVar3 - fVar6 * fVar5) * fVar9,fVar13 * fVar9);
  in_RDI->m_el[1].m_floats[2] = (fVar5 * fVar7 + -fVar3 * fVar2) * fVar9;
  *(ulong *)in_RDI->m_el[2].m_floats =
       CONCAT44(fVar9 * (fVar6 * fVar4 - fVar3 * (float)((ulong)uVar8 >> 0x20)),fVar9 * fVar14);
  in_RDI->m_el[2].m_floats[2] = fVar9 * (fVar3 * fVar1 + -fVar4 * fVar7);
  in_RDI->m_el[2].m_floats[3] = 0.0;
  return in_RDI;
}

Assistant:

SIMD_FORCE_INLINE btMatrix3x3 
btMatrix3x3::inverse() const
{
	btVector3 co(cofac(1, 1, 2, 2), cofac(1, 2, 2, 0), cofac(1, 0, 2, 1));
	btScalar det = (*this)[0].dot(co);
	btFullAssert(det != btScalar(0.0));
	btScalar s = btScalar(1.0) / det;
	return btMatrix3x3(co.x() * s, cofac(0, 2, 2, 1) * s, cofac(0, 1, 1, 2) * s,
		co.y() * s, cofac(0, 0, 2, 2) * s, cofac(0, 2, 1, 0) * s,
		co.z() * s, cofac(0, 1, 2, 0) * s, cofac(0, 0, 1, 1) * s);
}